

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDocPtr xmlDoRead(xmlParserCtxtPtr ctxt,char *URL,char *encoding,int options,int reuse)

{
  xmlCharEncodingHandlerPtr handler;
  xmlChar *pxVar1;
  xmlCharEncodingHandlerPtr hdlr;
  xmlDocPtr ret;
  int reuse_local;
  int options_local;
  char *encoding_local;
  char *URL_local;
  xmlParserCtxtPtr ctxt_local;
  
  xmlCtxtUseOptionsInternal(ctxt,options,encoding);
  if ((encoding != (char *)0x0) &&
     (handler = xmlFindCharEncodingHandler(encoding), handler != (xmlCharEncodingHandlerPtr)0x0)) {
    xmlSwitchToEncoding(ctxt,handler);
  }
  if (((URL != (char *)0x0) && (ctxt->input != (xmlParserInputPtr)0x0)) &&
     (ctxt->input->filename == (char *)0x0)) {
    pxVar1 = xmlStrdup((xmlChar *)URL);
    ctxt->input->filename = (char *)pxVar1;
  }
  xmlParseDocument(ctxt);
  if ((ctxt->wellFormed == 0) && (ctxt->recovery == 0)) {
    hdlr = (xmlCharEncodingHandlerPtr)0x0;
    if (ctxt->myDoc != (xmlDocPtr)0x0) {
      xmlFreeDoc(ctxt->myDoc);
    }
  }
  else {
    hdlr = (xmlCharEncodingHandlerPtr)ctxt->myDoc;
  }
  ctxt->myDoc = (xmlDocPtr)0x0;
  if (reuse == 0) {
    xmlFreeParserCtxt(ctxt);
  }
  return (xmlDocPtr)hdlr;
}

Assistant:

static xmlDocPtr
xmlDoRead(xmlParserCtxtPtr ctxt, const char *URL, const char *encoding,
          int options, int reuse)
{
    xmlDocPtr ret;

    DEBUG_ENTER(("xmlDoRead(%s, %s, %s, 0x%X, %d);\n", dbgCtxt(ctxt), URL, encoding, options, reuse));

    xmlCtxtUseOptionsInternal(ctxt, options, encoding);
    if (encoding != NULL) {
        xmlCharEncodingHandlerPtr hdlr;

	hdlr = xmlFindCharEncodingHandler(encoding);
	if (hdlr != NULL)
	    xmlSwitchToEncoding(ctxt, hdlr);
    }
    if ((URL != NULL) && (ctxt->input != NULL) &&
        (ctxt->input->filename == NULL))
        ctxt->input->filename = (char *) xmlStrdup((const xmlChar *) URL);
    xmlParseDocument(ctxt);
    if ((ctxt->wellFormed) || ctxt->recovery)
        ret = ctxt->myDoc;
    else {
        ret = NULL;
	if (ctxt->myDoc != NULL) {
	    xmlFreeDoc(ctxt->myDoc);
	}
    }
    ctxt->myDoc = NULL;
    if (!reuse) {
	xmlFreeParserCtxt(ctxt);
    }

    RETURN_PTR(ret);
}